

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O2

BOOL __thiscall
LASreadItemCompressed_RGBNIR14_v3::chunk_sizes(LASreadItemCompressed_RGBNIR14_v3 *this)

{
  ByteStreamIn *pBVar1;
  
  pBVar1 = this->dec->instream;
  (*pBVar1->_vptr_ByteStreamIn[3])(pBVar1,&this->num_bytes_RGB);
  (*pBVar1->_vptr_ByteStreamIn[3])(pBVar1,&this->num_bytes_NIR);
  return true;
}

Assistant:

BOOL LASreadItemCompressed_RGBNIR14_v3::chunk_sizes()
{
  /* for layered compression 'dec' only hands over the stream */

  ByteStreamIn* instream = dec->getByteStreamIn();

  /* read bytes per layer */

  instream->get32bitsLE(((U8*)&num_bytes_RGB));
  instream->get32bitsLE(((U8*)&num_bytes_NIR));

  return TRUE;
}